

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaValidateElem(xmlSchemaValidCtxtPtr vctxt)

{
  xmlSchemaElementPtr pxVar1;
  int local_20;
  int local_1c;
  int skip;
  int ret;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  local_1c = 0;
  _skip = vctxt;
  if ((vctxt->skipDepth != -1) && (vctxt->skipDepth <= vctxt->depth)) {
    xmlSchemaInternalErr((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidateElem","in skip-state");
    goto LAB_001fa5b0;
  }
  if (vctxt->xsiAssemble != 0) {
    local_1c = xmlSchemaAssembleByXSI(vctxt);
    if (local_1c != 0) {
      if (local_1c != -1) {
        _skip->skipDepth = 0;
        return local_1c;
      }
      goto LAB_001fa5b0;
    }
    xmlHashScan(_skip->schema->schemasImports,xmlSchemaAugmentImportedIDC,_skip);
  }
  if (_skip->depth < 1) {
    pxVar1 = xmlSchemaGetElem(_skip->schema,_skip->inode->localName,_skip->inode->nsName);
    _skip->inode->decl = pxVar1;
    if (_skip->inode->decl == (xmlSchemaElementPtr)0x0) {
      local_1c = 0x735;
      xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)_skip,XML_SCHEMAV_CVC_ELT_1,(xmlNodePtr)0x0,
                         (xmlSchemaBasicItemPtr)0x0,
                         "No matching global declaration available for the validation root",
                         (xmlChar *)0x0,(xmlChar *)0x0);
      goto LAB_001fa58e;
    }
LAB_001fa2ce:
    if (_skip->inode->decl == (xmlSchemaElementPtr)0x0) {
LAB_001fa3bf:
      if (_skip->inode->typeDef == (xmlSchemaTypePtr)0x0) {
        _skip->inode->flags = _skip->inode->flags | 0x400;
        local_1c = 0x753;
        xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)_skip,XML_SCHEMAV_CVC_TYPE_1,(xmlNodePtr)0x0,
                           (xmlSchemaBasicItemPtr)0x0,"The type definition is absent",(xmlChar *)0x0
                           ,(xmlChar *)0x0);
      }
      else if ((_skip->inode->typeDef->flags & 0x100000U) == 0) {
        if (_skip->xpathStates != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
          local_1c = xmlSchemaXPathEvaluate(_skip,XML_ELEMENT_NODE);
          _skip->inode->appliedXPath = 1;
          if (local_1c == -1) {
            xmlSchemaInternalErr
                      ((xmlSchemaAbstractCtxtPtr)_skip,"xmlSchemaValidateElem",
                       "calling xmlSchemaXPathEvaluate()");
            goto LAB_001fa5b0;
          }
        }
        if ((_skip->inode->typeDef->type == XML_SCHEMA_TYPE_COMPLEX) ||
           (_skip->inode->typeDef->builtInType == 0x2d)) {
          if ((_skip->nbAttrInfos != 0) || (_skip->inode->typeDef->attrUses != (void *)0x0)) {
            local_1c = xmlSchemaVAttributesComplex(_skip);
          }
        }
        else if (_skip->nbAttrInfos != 0) {
          local_1c = xmlSchemaVAttributesSimple(_skip);
        }
        if (_skip->nbAttrInfos != 0) {
          xmlSchemaClearAttrInfos(_skip);
        }
        if (local_1c == -1) {
          xmlSchemaInternalErr
                    ((xmlSchemaAbstractCtxtPtr)_skip,"xmlSchemaValidateElem",
                     "calling attributes validation");
          goto LAB_001fa5b0;
        }
        local_1c = 0;
      }
      else {
        _skip->inode->flags = _skip->inode->flags | 0x400;
        local_1c = 0x754;
        xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)_skip,XML_SCHEMAV_CVC_TYPE_2,(xmlNodePtr)0x0,
                           (xmlSchemaBasicItemPtr)0x0,"The type definition is abstract",
                           (xmlChar *)0x0,(xmlChar *)0x0);
      }
    }
    else if (_skip->inode->decl->type == XML_SCHEMA_TYPE_ANY) {
      local_1c = xmlSchemaValidateElemWildcard(_skip,&local_20);
      if (local_1c == 0) {
        if (local_20 == 0) {
          if (_skip->inode->decl->type != XML_SCHEMA_TYPE_ELEMENT) {
            _skip->inode->decl = (xmlSchemaElementPtr)0x0;
            local_1c = 0;
            goto LAB_001fa3bf;
          }
          local_1c = 0;
          goto LAB_001fa384;
        }
        _skip->skipDepth = _skip->depth;
      }
      else if (local_1c < 0) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)_skip,"xmlSchemaValidateElem",
                   "calling xmlSchemaValidateElemWildcard()");
        goto LAB_001fa5b0;
      }
    }
    else {
LAB_001fa384:
      local_1c = xmlSchemaValidateElemDecl(_skip);
      if (local_1c == 0) {
        local_1c = 0;
        goto LAB_001fa3bf;
      }
      if (local_1c < 0) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)_skip,"xmlSchemaValidateElem",
                   "calling xmlSchemaValidateElemDecl()");
        goto LAB_001fa5b0;
      }
    }
LAB_001fa58e:
    if (local_1c != 0) {
      _skip->skipDepth = _skip->depth;
    }
    vctxt_local._4_4_ = local_1c;
  }
  else {
    local_1c = xmlSchemaValidateChildElem(_skip);
    if (local_1c == 0) {
      if (_skip->depth == _skip->skipDepth) goto LAB_001fa58e;
      if ((_skip->inode->decl != (xmlSchemaElementPtr)0x0) ||
         (_skip->inode->typeDef != (xmlSchemaTypePtr)0x0)) {
        local_1c = 0;
        goto LAB_001fa2ce;
      }
      xmlSchemaInternalErr
                ((xmlSchemaAbstractCtxtPtr)_skip,"xmlSchemaValidateElem",
                 "the child element was valid but neither the declaration nor the type was set");
    }
    else {
      if (-1 < local_1c) goto LAB_001fa58e;
      xmlSchemaInternalErr
                ((xmlSchemaAbstractCtxtPtr)_skip,"xmlSchemaValidateElem",
                 "calling xmlSchemaStreamValidateChildElement()");
    }
LAB_001fa5b0:
    vctxt_local._4_4_ = -1;
  }
  return vctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaValidateElem(xmlSchemaValidCtxtPtr vctxt)
{
    int ret = 0;

    if ((vctxt->skipDepth != -1) &&
	(vctxt->depth >= vctxt->skipDepth)) {
	VERROR_INT("xmlSchemaValidateElem",
	    "in skip-state");
	goto internal_error;
    }
    if (vctxt->xsiAssemble) {
	/*
	* We will stop validation if there was an error during
	* dynamic schema construction.
	* Note that we simply set @skipDepth to 0, this could
	* mean that a streaming document via SAX would be
	* still read to the end but it won't be validated any more.
	* TODO: If we are sure how to stop the validation at once
	*   for all input scenarios, then this should be changed to
	*   instantly stop the validation.
	*/
	ret = xmlSchemaAssembleByXSI(vctxt);
	if (ret != 0) {
	    if (ret == -1)
		goto internal_error;
	    vctxt->skipDepth = 0;
	    return(ret);
	}
        /*
         * Augment the IDC definitions for the main schema and all imported ones
         * NOTE: main schema is the first in the imported list
         */
        xmlHashScan(vctxt->schema->schemasImports, xmlSchemaAugmentImportedIDC,
                    vctxt);
    }
    if (vctxt->depth > 0) {
	/*
	* Validate this element against the content model
	* of the parent.
	*/
	ret = xmlSchemaValidateChildElem(vctxt);
	if (ret != 0) {
	    if (ret < 0) {
		VERROR_INT("xmlSchemaValidateElem",
		    "calling xmlSchemaStreamValidateChildElement()");
		goto internal_error;
	    }
	    goto exit;
	}
	if (vctxt->depth == vctxt->skipDepth)
	    goto exit;
	if ((vctxt->inode->decl == NULL) &&
	    (vctxt->inode->typeDef == NULL)) {
	    VERROR_INT("xmlSchemaValidateElem",
		"the child element was valid but neither the "
		"declaration nor the type was set");
	    goto internal_error;
	}
    } else {
	/*
	* Get the declaration of the validation root.
	*/
	vctxt->inode->decl = xmlSchemaGetElem(vctxt->schema,
	    vctxt->inode->localName,
	    vctxt->inode->nsName);
	if (vctxt->inode->decl == NULL) {
	    ret = XML_SCHEMAV_CVC_ELT_1;
	    VERROR(ret, NULL,
		"No matching global declaration available "
		"for the validation root");
	    goto exit;
	}
    }

    if (vctxt->inode->decl == NULL)
	goto type_validation;

    if (vctxt->inode->decl->type == XML_SCHEMA_TYPE_ANY) {
	int skip;
	/*
	* Wildcards.
	*/
	ret = xmlSchemaValidateElemWildcard(vctxt, &skip);
	if (ret != 0) {
	    if (ret < 0) {
		VERROR_INT("xmlSchemaValidateElem",
		    "calling xmlSchemaValidateElemWildcard()");
		goto internal_error;
	    }
	    goto exit;
	}
	if (skip) {
	    vctxt->skipDepth = vctxt->depth;
	    goto exit;
	}
	/*
	* The declaration might be set by the wildcard validation,
	* when the processContents is "lax" or "strict".
	*/
	if (vctxt->inode->decl->type != XML_SCHEMA_TYPE_ELEMENT) {
	    /*
	    * Clear the "decl" field to not confuse further processing.
	    */
	    vctxt->inode->decl = NULL;
	    goto type_validation;
	}
    }
    /*
    * Validate against the declaration.
    */
    ret = xmlSchemaValidateElemDecl(vctxt);
    if (ret != 0) {
	if (ret < 0) {
	    VERROR_INT("xmlSchemaValidateElem",
		"calling xmlSchemaValidateElemDecl()");
	    goto internal_error;
	}
	goto exit;
    }
    /*
    * Validate against the type definition.
    */
type_validation:

    if (vctxt->inode->typeDef == NULL) {
	vctxt->inode->flags |= XML_SCHEMA_NODE_INFO_ERR_BAD_TYPE;
	ret = XML_SCHEMAV_CVC_TYPE_1;
	VERROR(ret, NULL,
	    "The type definition is absent");
	goto exit;
    }
    if (vctxt->inode->typeDef->flags & XML_SCHEMAS_TYPE_ABSTRACT) {
	vctxt->inode->flags |= XML_SCHEMA_NODE_INFO_ERR_BAD_TYPE;
	ret = XML_SCHEMAV_CVC_TYPE_2;
	    VERROR(ret, NULL,
	    "The type definition is abstract");
	goto exit;
    }
    /*
    * Evaluate IDCs. Do it here, since new IDC matchers are registered
    * during validation against the declaration. This must be done
    * _before_ attribute validation.
    */
    if (vctxt->xpathStates != NULL) {
	ret = xmlSchemaXPathEvaluate(vctxt, XML_ELEMENT_NODE);
	vctxt->inode->appliedXPath = 1;
	if (ret == -1) {
	    VERROR_INT("xmlSchemaValidateElem",
		"calling xmlSchemaXPathEvaluate()");
	    goto internal_error;
	}
    }
    /*
    * Validate attributes.
    */
    if (WXS_IS_COMPLEX(vctxt->inode->typeDef)) {
	if ((vctxt->nbAttrInfos != 0) ||
	    (vctxt->inode->typeDef->attrUses != NULL)) {

	    ret = xmlSchemaVAttributesComplex(vctxt);
	}
    } else if (vctxt->nbAttrInfos != 0) {

	ret = xmlSchemaVAttributesSimple(vctxt);
    }
    /*
    * Clear registered attributes.
    */
    if (vctxt->nbAttrInfos != 0)
	xmlSchemaClearAttrInfos(vctxt);
    if (ret == -1) {
	VERROR_INT("xmlSchemaValidateElem",
	    "calling attributes validation");
	goto internal_error;
    }
    /*
    * Don't return an error if attributes are invalid on purpose.
    */
    ret = 0;

exit:
    if (ret != 0)
	vctxt->skipDepth = vctxt->depth;
    return (ret);
internal_error:
    return (-1);
}